

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ip_config.c
# Opt level: O3

int get_self_ip_iface(CMTransport_trace trace_func,void *trace_data,char *iface)

{
  uint uVar1;
  short *psVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  hostent *phVar6;
  char **ppcVar7;
  void *pvVar8;
  size_t __n;
  char *pcVar9;
  uint uVar10;
  in_addr_t iVar11;
  uint *puVar12;
  ulong uVar13;
  ifaddrs *if_addrs;
  ifconf ifaces;
  char buf [46];
  char str_2 [16];
  char hostname_buf [256];
  undefined8 *local_190;
  int local_188 [2];
  void *local_180;
  char local_178 [48];
  char local_148 [16];
  char local_138 [264];
  
  local_190 = (undefined8 *)0x0;
  iVar3 = getifaddrs();
  if (iVar3 == 0) {
    if ((iface != (char *)0x0) || (iface = getenv("ADIOS2_INTERFACE"), iface != (char *)0x0)) {
      pvVar8 = trace_data;
      (*trace_func)((CManager_conflict)trace_data,"CM<IP_CONFIG> searching for interface %s\n",iface
                   );
      if (get_self_ip_iface_first_call == '\0') {
        dump_output((int)pvVar8,"\tADIOS2_IP_CONFIG interface %s requested\n",iface);
      }
      for (; local_190 != (undefined8 *)0x0; local_190 = (undefined8 *)*local_190) {
        psVar2 = (short *)local_190[3];
        if ((psVar2 != (short *)0x0) && (*psVar2 == 2)) {
          pcVar5 = (char *)local_190[1];
          __n = strlen(iface);
          iVar3 = strncmp(pcVar5,iface,__n);
          if (iVar3 == 0) {
            puVar12 = (uint *)(psVar2 + 2);
            pcVar9 = inet_ntop(2,puVar12,local_178,0x2e);
            (*trace_func)((CManager_conflict)trace_data,
                          "CM<IP_CONFIG> Interface specified, returning ->%s : %s",pcVar5,pcVar9);
            if (get_self_ip_iface_first_call == '\0') {
              iVar3 = 2;
              pcVar5 = inet_ntop(2,puVar12,local_178,0x2e);
              dump_output(iVar3,"\tADIOS2_IP_CONFIG interface %s found, using IP %s\n",iface,pcVar5)
              ;
            }
            uVar10 = *puVar12;
            free((void *)0x0);
            get_self_ip_iface_first_call = '\x01';
            return uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 |
                   uVar10 << 0x18;
          }
        }
      }
      printf("Warning!  ADIOS2_INTERFACE specified as \"%s\", but no active interface by that name found\n"
             ,iface);
    }
    get_self_ip_iface_first_call = '\x01';
    gethostname(local_138,0x100);
    pcVar5 = index(local_138,0x2e);
    if ((pcVar5 == (char *)0x0) || (phVar6 = gethostbyname(local_138), phVar6 == (hostent *)0x0)) {
      phVar6 = (hostent *)0x0;
    }
    else {
      ppcVar7 = phVar6->h_addr_list;
      puVar12 = (uint *)*ppcVar7;
      while (puVar12 != (uint *)0x0) {
        ppcVar7 = ppcVar7 + 1;
        if ((char)*puVar12 != '\x7f') {
          inet_ntop(2,puVar12,(char *)local_188,0x10);
          (*trace_func)((CManager_conflict)trace_data,
                        "CM<IP_CONFIG> Prefer IP associated with hostname net -> %s",local_188);
          free((void *)0x0);
          goto LAB_0013c098;
        }
        puVar12 = (uint *)*ppcVar7;
      }
    }
  }
  else {
    phVar6 = (hostent *)0x0;
  }
  gethostname(local_138,0x100);
  pcVar5 = strchr(local_138,0x2e);
  if (pcVar5 != (char *)0x0) {
    phVar6 = gethostbyname(local_138);
  }
  if (phVar6 != (hostent *)0x0) {
    ppcVar7 = phVar6->h_addr_list;
    puVar12 = (uint *)*ppcVar7;
    while (puVar12 != (uint *)0x0) {
      ppcVar7 = ppcVar7 + 1;
      if ((char)*puVar12 != '\x7f') {
        inet_ntop(2,puVar12,(char *)local_188,0x10);
        uVar10 = *puVar12;
        (*trace_func)((CManager_conflict)trace_data,"CM<IP_CONFIG> - Get self IP addr %lx, net %s",
                      (ulong)(uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 |
                             uVar10 << 0x18),local_188);
LAB_0013c098:
        uVar10 = *puVar12;
        return uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18;
      }
      puVar12 = (uint *)*ppcVar7;
    }
  }
  iVar3 = socket(2,2,0);
  local_188[0] = 0xa00;
  pvVar8 = malloc(0xa00);
  local_180 = pvVar8;
  iVar4 = ioctl(iVar3,0x8912,local_188);
  iVar11 = 0;
  if ((-1 < iVar4) && (uVar13 = (ulong)(long)local_188[0] / 0x28, iVar11 = 0, (int)uVar13 != 0)) {
    puVar12 = (uint *)((long)local_180 + 0x14);
    do {
      ioctl(iVar3,0x8913,puVar12 + -5);
      uVar10 = puVar12[-1];
      if ((uVar10 & 8) == 0) {
        if ((uVar10 & 1) == 0) {
          uVar10 = *puVar12;
          uVar10 = uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 |
                   uVar10 << 0x18;
          pcVar5 = "CM<IP_CONFIG> - Get self IP addr %lx, rejected, not UP";
        }
        else {
          uVar1 = *puVar12;
          if ((uVar10 & 0x40) != 0) {
            if ((uVar1 == 0) || (uVar1 == 0x7f000001)) goto LAB_0013bd96;
            iVar11 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18
            ;
            inet_ntop(2,puVar12,local_148,0x10);
            uVar10 = *puVar12;
            (*trace_func)((CManager_conflict)trace_data,
                          "CM<IP_CONFIG> - Get self IP addr DHCP %lx, net %s",
                          (ulong)(uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8
                                 | uVar10 << 0x18),local_148);
            goto LAB_0013bfc4;
          }
          uVar10 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
          pcVar5 = "CM<IP_CONFIG> - Get self IP addr %lx, rejected, not RUNNING";
        }
        (*trace_func)((CManager_conflict)trace_data,pcVar5,(ulong)uVar10);
      }
      else {
        pcVar5 = inet_ntoa((in_addr)*puVar12);
        (*trace_func)((CManager_conflict)trace_data,
                      "CM<IP_CONFIG> - Get self IP addr %s, rejected, loopback",pcVar5);
      }
LAB_0013bd96:
      uVar10 = (int)uVar13 - 1;
      uVar13 = (ulong)uVar10;
      puVar12 = puVar12 + 10;
    } while (uVar10 != 0);
    iVar11 = 0;
  }
LAB_0013bfc4:
  close(iVar3);
  free(pvVar8);
  if (iVar11 == 0) {
    pcVar5 = getenv("ADIOS2_LAST_RESORT_IP_ADDR");
    iVar11 = 0;
    (*trace_func)((CManager_conflict)trace_data,"CM<IP_CONFIG> - Get self IP addr at last resort");
    if (pcVar5 != (char *)0x0) {
      (*trace_func)((CManager_conflict)trace_data,"CM<IP_CONFIG> - Translating last resort %s",
                    pcVar5);
      iVar11 = inet_addr(pcVar5);
    }
  }
  return iVar11;
}

Assistant:

static int
get_self_ip_iface(CMTransport_trace trace_func, void* trace_data, char *iface)
{
    struct hostent *host = NULL;
    char hostname_buf[256];
    char **p;
#ifdef HAVE_GETIFADDRS
  struct ifaddrs *if_addrs = NULL;
  struct ifaddrs *if_addr = NULL;
  void *tmp = NULL;
  char buf[INET6_ADDRSTRLEN];
#endif
#ifdef SIOCGIFCONF
    char *ifreqs;
    struct ifreq *ifr;
    struct sockaddr_in *sai;
    struct ifconf ifaces;
    int ifrn;
    int ss;
    int ipv4_count = 0;
    int ipv6_count = 0;
    static int first_call = 1;
#endif
    int rv = 0;
#ifdef HAVE_GETIFADDRS
    if (getifaddrs(&if_addrs) == 0) {    
	// Print possible addresses
	for (if_addr = if_addrs; if_addr != NULL; if_addr = if_addr->ifa_next) {
	    int family;
	    if (!if_addr->ifa_addr) continue;
	    family = if_addr->ifa_addr->sa_family;
	    if ((family != AF_INET) && (family != AF_INET6)) continue;
	    if (if_addr->ifa_addr->sa_family == AF_INET) {
	        tmp = &((struct sockaddr_in *)if_addr->ifa_addr)->sin_addr;
		ipv4_count++;
	    } else {
	        tmp = &((struct sockaddr_in6 *)if_addr->ifa_addr)->sin6_addr;
		ipv6_count++;
	    }
	    trace_func(trace_data, "CM<IP_CONFIG> IP possibility -> %s : %s",
		       if_addr->ifa_name,
		       inet_ntop(family, tmp, buf, sizeof(buf)));
	    if ((family == AF_INET) && first_call) {
		dump_output(1023, "\t" IPCONFIG_ENVVAR_PREFIX "IP_CONFIG Possible interface %s : IPV4 %s\n",
			    if_addr->ifa_name,
			    inet_ntop(family, tmp, buf, sizeof(buf)));
	    } else {
		// until we support IPV6, don't dump info
		//dump_output(1023, "\t" IPCONFIG_ENVVAR_PREFIX "IP_CONFIG Possible interface %s : IPV6 %s\n",
		//	    if_addr->ifa_name,
		//	    inet_ntop(family, tmp, buf, sizeof(buf)));
	    }
	}
	if (!iface) iface = getenv(IPCONFIG_ENVVAR_PREFIX "INTERFACE");
	if (iface != NULL) {
	    trace_func(trace_data, "CM<IP_CONFIG> searching for interface %s\n", iface);
	    if (first_call) dump_output(1023, "\t" IPCONFIG_ENVVAR_PREFIX "IP_CONFIG interface %s requested\n", iface);
	    for (if_addr = if_addrs; if_addr != NULL; if_addr = if_addr->ifa_next) {
	        int family;
		uint32_t IP;
	        if (!if_addr->ifa_addr) continue;
		family = if_addr->ifa_addr->sa_family;
		if (family != AF_INET) continue;  /* currently not looking for ipv6 */
		if (strncmp(if_addr->ifa_name, iface, strlen(iface)) != 0) continue;
		tmp = &((struct sockaddr_in *)if_addr->ifa_addr)->sin_addr;
		trace_func(trace_data, "CM<IP_CONFIG> Interface specified, returning ->%s : %s",
			   if_addr->ifa_name,
			   inet_ntop(family, tmp, buf, sizeof(buf)));
		if (first_call)
		dump_output(1023, "\t" IPCONFIG_ENVVAR_PREFIX "IP_CONFIG interface %s found, using IP %s\n", iface,
			   inet_ntop(family, tmp, buf, sizeof(buf)));
		IP = ntohl(*(uint32_t*)tmp);
		free(if_addrs);
		first_call = 0;
		return IP;
	    }
	    printf("Warning!  " IPCONFIG_ENVVAR_PREFIX "INTERFACE specified as \"%s\", but no active interface by that name found\n", iface);
	}
	    
	first_call = 0;
	gethostname(hostname_buf, sizeof(hostname_buf));
	if (index(hostname_buf, '.') != NULL) {
	    /* don't even check for host if not fully qualified */
	    host = gethostbyname(hostname_buf);
	}
	if (host != NULL) {
	    for (p = host->h_addr_list; *p != 0; p++) {
		struct in_addr *in = *(struct in_addr **) p;
		if (!ipv4_is_loopback(ntohl(in->s_addr))) {
		    char str[INET_ADDRSTRLEN];
					      
		    inet_ntop(AF_INET, &(in->s_addr), str, sizeof(str));
		    trace_func(trace_data, "CM<IP_CONFIG> Prefer IP associated with hostname net -> %s", str);
		    free(if_addrs);
		    return (ntohl(in->s_addr));
		}
	    }
	}
	/* choose the first thing that's not a loopback interface */
	for (if_addr = if_addrs; if_addr != NULL; if_addr = if_addr->ifa_next) {
	    int family;
	    uint32_t ret_ip;
	    if (!if_addr->ifa_addr) continue;
	    family = if_addr->ifa_addr->sa_family;
	    if (family != AF_INET) continue;  /* currently not looking for ipv6 */
	    if ((if_addr->ifa_flags & IFF_LOOPBACK) != 0)  continue;
	    tmp = &((struct sockaddr_in *)if_addr->ifa_addr)->sin_addr;
	    trace_func(trace_data, "CM<IP_CONFIG> get_self_ip_addr returning first avail -> %s : %s",
			       if_addr->ifa_name,
			       inet_ntop(family, tmp, buf, sizeof(buf)));
	    ret_ip = (ntohl(*(uint32_t*)tmp));
	    free(if_addrs);
	    return ret_ip;
	}
    }
#endif	
    gethostname(hostname_buf, sizeof(hostname_buf));
    if (strchr(hostname_buf, '.') != NULL) {
	/* don't even check for host if not fully qualified */
	host = gethostbyname(hostname_buf);
    }
    if (host != NULL) {
	for (p = host->h_addr_list; *p != 0; p++) {
	    struct in_addr *in = *(struct in_addr **) p;
	    if (!ipv4_is_loopback(ntohl(in->s_addr))) {
	        char str[INET_ADDRSTRLEN];
					      
		inet_ntop(AF_INET, &(in->s_addr), str, sizeof(str));
		trace_func(trace_data, "CM<IP_CONFIG> - Get self IP addr %lx, net %s",
			   ntohl(in->s_addr), str);
		return (ntohl(in->s_addr));
	    }
	}
    }
    /*
     *  Since we couldn't find an IP address in some logical way, we'll open
     *  a DGRAM socket and ask it first for the list of its interfaces, and
     *  then checking for an interface we can use, and then finally asking that
     *  interface what its address is.
     */
#ifdef SIOCGIFCONF
    ss = socket(AF_INET, SOCK_DGRAM, 0);
    ifaces.ifc_len = 64 * sizeof(struct ifreq);
    ifaces.ifc_buf = ifreqs = malloc(ifaces.ifc_len);
    /*
     *  if we can't SIOCGIFCONF we're kind of dead anyway, bail.
     */
    if (ioctl(ss, SIOCGIFCONF, &ifaces) >= 0) {
	ifr = ifaces.ifc_req;
	ifrn = ifaces.ifc_len / sizeof(struct ifreq);
	for (; ifrn--; ifr++) {
	    char str[INET_ADDRSTRLEN];
	    /*
	     * Basically we'll take the first interface satisfying 
	     * the following: 
	     *   up, running, not loopback, address family is INET.
	     */
	    ioctl(ss, SIOCGIFFLAGS, ifr);
	    sai = (struct sockaddr_in *) &(ifr->ifr_addr);
	    if (ifr->ifr_flags & IFF_LOOPBACK) {
		trace_func(trace_data, "CM<IP_CONFIG> - Get self IP addr %s, rejected, loopback",
			   inet_ntoa(sai->sin_addr));
		continue;
	    }
	    if (!(ifr->ifr_flags & IFF_UP)) {
		trace_func(trace_data, "CM<IP_CONFIG> - Get self IP addr %lx, rejected, not UP",
			   ntohl(sai->sin_addr.s_addr));
		continue;
	    }
	    if (!(ifr->ifr_flags & IFF_RUNNING)) {
		trace_func(trace_data, "CM<IP_CONFIG> - Get self IP addr %lx, rejected, not RUNNING",
			   ntohl(sai->sin_addr.s_addr));
		continue;
	    }
	    /*
	     * sure would be nice to test for AF_INET here but it doesn't
	     * cooperate and I've done enough for now ...
	     * if (sai->sin_addr.s.addr != AF_INET) continue;
	    */
	    if (sai->sin_addr.s_addr == INADDR_ANY)
		continue;
	    if (sai->sin_addr.s_addr == INADDR_LOOPBACK)
		continue;
	    rv = ntohl(sai->sin_addr.s_addr);
					      
	    inet_ntop(AF_INET, &(sai->sin_addr.s_addr), str, sizeof(str));
	    trace_func(trace_data, "CM<IP_CONFIG> - Get self IP addr DHCP %lx, net %s",
		       ntohl(sai->sin_addr.s_addr), str);
	    break;
	}
    }
    close(ss);
    free(ifreqs);
#endif
    /*
     *  Absolute last resort.  If we can't figure out anything else, look
     *  for the CM_LAST_RESORT_IP_ADDR environment variable.
     */
    if (rv == 0) {
	char *c = getenv(IPCONFIG_ENVVAR_PREFIX "LAST_RESORT_IP_ADDR");
	trace_func(trace_data, "CM<IP_CONFIG> - Get self IP addr at last resort");
	if (c != NULL) {
	    trace_func(trace_data, "CM<IP_CONFIG> - Translating last resort %s", c);
	    rv = inet_addr(c);
	}
    }
    /*
     *	hopefully by now we've set rv to something useful.  If not,
     *  GET A BETTER NETWORK CONFIGURATION.
     */
    return rv;
}